

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

void communicate(char *shared_memory,Arguments *args)

{
  int iVar1;
  atomic_char *guard;
  
  *shared_memory = 's';
  if (0 < args->count) {
    do {
      do {
      } while (*shared_memory != 'c');
      memset(shared_memory + 1,0x2a,(long)args->size);
      LOCK();
      *shared_memory = 's';
      UNLOCK();
      iVar1 = args->count;
      args->count = iVar1 + -1;
    } while (1 < iVar1);
  }
  return;
}

Assistant:

void communicate(char* shared_memory, struct Arguments* args) {
	// Buffer into which to read data
	void* buffer = malloc(args->size);

	atomic_char* guard = (atomic_char*)shared_memory;
	atomic_init(guard, 's');
	assert(sizeof(atomic_char) == 1);

	for (; args->count > 0; --args->count) {
		shm_wait(guard);
		// Read
		memcpy(buffer, shared_memory + 1, args->size);

		// Write back
		memset(shared_memory + 1, '*', args->size);

		shm_notify(guard);
	}

	free(buffer);
}